

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

int32_t __thiscall icu_63::LocalizationInfo::indexForRuleSet(LocalizationInfo *this,UChar *ruleset)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  UChar *s2;
  undefined4 extraout_var_00;
  uint uVar4;
  undefined4 extraout_var;
  
  if (ruleset != (UChar *)0x0) {
    iVar2 = (*this->_vptr_LocalizationInfo[3])();
    bVar1 = 0 < iVar2;
    if (0 < iVar2) {
      uVar4 = 0;
      iVar2 = (*this->_vptr_LocalizationInfo[4])(this,0);
      s2 = (UChar *)CONCAT44(extraout_var,iVar2);
      if (s2 != ruleset) {
        uVar4 = 0;
        do {
          if ((s2 != (UChar *)0x0) && (iVar3 = u_strcmp_63(ruleset,s2), iVar3 == 0)) break;
          uVar4 = uVar4 + 1;
          iVar2 = (*this->_vptr_LocalizationInfo[3])(this);
          bVar1 = (int)uVar4 < iVar2;
          if (iVar2 <= (int)uVar4) {
            return -1;
          }
          iVar2 = (*this->_vptr_LocalizationInfo[4])(this,(ulong)uVar4);
          s2 = (UChar *)CONCAT44(extraout_var_00,iVar2);
        } while (s2 != ruleset);
      }
      if (bVar1) {
        return uVar4;
      }
    }
  }
  return -1;
}

Assistant:

int32_t
LocalizationInfo::indexForRuleSet(const UChar* ruleset) const {
    if (ruleset) {
        for (int i = 0; i < getNumberOfRuleSets(); ++i) {
            if (streq(ruleset, getRuleSetName(i))) {
                return i;
            }
        }
    }
    return -1;
}